

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editcol.c
# Opt level: O0

int ffcprw(fitsfile *infptr,fitsfile *outfptr,LONGLONG firstrow,LONGLONG nrows,int *status)

{
  int iVar1;
  fitsfile *fptr;
  fitsfile *fptr_00;
  int *status_00;
  long lVar2;
  long in_RCX;
  fitsfile *in_RDX;
  int *in_RSI;
  int *in_RDI;
  int *in_R8;
  uchar *varColBuff1;
  tcolumn *colptr;
  LONGLONG hoffset;
  LONGLONG hrepeat;
  long nNewBlocks;
  int *outVarCols;
  int *inVarCols;
  int varColDiff;
  int nOutVarCols;
  int nInVarCols;
  uchar *varColBuff;
  uchar *buffer;
  LONGLONG nVarAllocBytes;
  LONGLONG nVarBytes;
  LONGLONG outPos;
  LONGLONG inPos;
  LONGLONG iVarCol;
  LONGLONG icol;
  LONGLONG jj;
  LONGLONG ii;
  LONGLONG outnaxis2;
  LONGLONG outnaxis1;
  LONGLONG innaxis2;
  LONGLONG innaxis1;
  int *in_stack_00001640;
  int in_stack_0000164c;
  long in_stack_00001650;
  fitsfile *in_stack_00001658;
  int *in_stack_ffffffffffffff18;
  int *status_01;
  int *colnums;
  fitsfile *nvarcols;
  fitsfile *in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff50;
  int iVar3;
  int iVar4;
  int iVar5;
  int *status_02;
  int *status_03;
  LONGLONG *in_stack_ffffffffffffff68;
  fitsfile *status_04;
  fitsfile *in_stack_ffffffffffffff78;
  fitsfile *fptr_01;
  int *in_stack_ffffffffffffff80;
  fitsfile *in_stack_ffffffffffffff88;
  long in_stack_ffffffffffffff90;
  fitsfile *in_stack_ffffffffffffff98;
  fitsfile *pfVar6;
  long local_50;
  size_t local_48;
  long local_40;
  size_t local_38;
  int local_4;
  
  status_04 = (fitsfile *)0x0;
  status_02 = (int *)0x0;
  iVar5 = 0;
  iVar4 = 0;
  iVar3 = 0;
  nvarcols = (fitsfile *)0x0;
  colnums = (int *)0x0;
  status_01 = (int *)0x0;
  if (*in_R8 < 1) {
    if (*in_RDI == *(int *)(*(long *)(in_RDI + 2) + 0x54)) {
      if (*(long *)(*(long *)(in_RDI + 2) + 0x88) == -1) {
        ffrdef((fitsfile *)outVarCols,(int *)nNewBlocks);
      }
    }
    else {
      ffmahd(in_stack_ffffffffffffff98,(int)((ulong)in_stack_ffffffffffffff90 >> 0x20),
             &in_stack_ffffffffffffff88->HDUposition,in_stack_ffffffffffffff80);
    }
    if (*in_RSI == *(int *)(*(long *)(in_RSI + 2) + 0x54)) {
      if (*(long *)(*(long *)(in_RSI + 2) + 0x88) == -1) {
        ffrdef((fitsfile *)outVarCols,(int *)nNewBlocks);
      }
    }
    else {
      ffmahd(in_stack_ffffffffffffff98,(int)((ulong)in_stack_ffffffffffffff90 >> 0x20),
             &in_stack_ffffffffffffff88->HDUposition,in_stack_ffffffffffffff80);
    }
    if (*in_R8 < 1) {
      if ((*(int *)(*(long *)(in_RDI + 2) + 0x58) == 0) ||
         (*(int *)(*(long *)(in_RSI + 2) + 0x58) == 0)) {
        ffpmsg((char *)0x12433c);
        *in_R8 = 0xeb;
        local_4 = 0xeb;
      }
      else if (((*(int *)(*(long *)(in_RDI + 2) + 0x58) == 2) &&
               (*(int *)(*(long *)(in_RSI + 2) + 0x58) == 1)) ||
              ((*(int *)(*(long *)(in_RDI + 2) + 0x58) == 1 &&
               (*(int *)(*(long *)(in_RSI + 2) + 0x58) == 2)))) {
        ffpmsg((char *)0x1243ae);
        *in_R8 = 0xe3;
        local_4 = 0xe3;
      }
      else {
        ffgkyjj(in_stack_ffffffffffffff78,(char *)status_04,in_stack_ffffffffffffff68,
                (char *)status_02,(int *)CONCAT44(iVar5,iVar4));
        ffgkyjj(in_stack_ffffffffffffff78,(char *)status_04,in_stack_ffffffffffffff68,
                (char *)status_02,(int *)CONCAT44(iVar5,iVar4));
        ffgkyjj(in_stack_ffffffffffffff78,(char *)status_04,in_stack_ffffffffffffff68,
                (char *)status_02,(int *)CONCAT44(iVar5,iVar4));
        ffgkyjj(in_stack_ffffffffffffff78,(char *)status_04,in_stack_ffffffffffffff68,
                (char *)status_02,(int *)CONCAT44(iVar5,iVar4));
        if (*in_R8 < 1) {
          if (local_48 == local_38) {
            if (local_40 < (long)((long)in_RDX + in_RCX + -1)) {
              ffpmsg((char *)0x1244f5);
              *in_R8 = 0x133;
              local_4 = 0x133;
            }
            else if (*(int *)(*(long *)(in_RDI + 2) + 0x3b0) ==
                     *(int *)(*(long *)(in_RSI + 2) + 0x3b0)) {
              fptr = (fitsfile *)malloc(local_38);
              if (fptr == (fitsfile *)0x0) {
                ffpmsg((char *)0x124589);
                *in_R8 = 0x71;
                local_4 = 0x71;
              }
              else {
                fptr_00 = (fitsfile *)malloc((long)*(int *)(*(long *)(in_RDI + 2) + 0x3b0) << 2);
                status_00 = (int *)malloc((long)*(int *)(*(long *)(in_RSI + 2) + 0x3b0) << 2);
                fffvcl(in_stack_ffffffffffffff38,&nvarcols->HDUposition,colnums,status_01);
                fffvcl(in_stack_ffffffffffffff38,&nvarcols->HDUposition,colnums,status_01);
                if (iVar5 == iVar4) {
                  for (lVar2 = 0; lVar2 < iVar5; lVar2 = lVar2 + 1) {
                    if ((&fptr_00->HDUposition)[lVar2] != status_00[lVar2]) {
                      iVar3 = 1;
                      break;
                    }
                  }
                }
                else {
                  iVar3 = 1;
                }
                if (iVar3 == 0) {
                  lVar2 = local_50 + 1;
                  pfVar6 = in_RDX;
                  if (iVar5 == 0) {
                    for (; (long)pfVar6 < (long)((long)&in_RDX->HDUposition + in_RCX);
                        pfVar6 = (fitsfile *)((long)&pfVar6->HDUposition + 1)) {
                      ffgtbb(fptr_00,(LONGLONG)status_00,(LONGLONG)in_stack_ffffffffffffff38,
                             (LONGLONG)nvarcols,(uchar *)colnums,status_01);
                      ffptbb(pfVar6,lVar2,(LONGLONG)in_stack_ffffffffffffff98,
                             in_stack_ffffffffffffff90,(uchar *)in_stack_ffffffffffffff88,
                             in_stack_ffffffffffffff80);
                      lVar2 = lVar2 + 1;
                    }
                  }
                  else {
                    ffirow(in_stack_ffffffffffffff78,(LONGLONG)status_04,(LONGLONG)fptr,status_02);
                    for (; (long)pfVar6 < (long)((long)&in_RDX->HDUposition + in_RCX);
                        pfVar6 = (fitsfile *)((long)&pfVar6->HDUposition + 1)) {
                      ffgtbb(fptr_00,(LONGLONG)status_00,(LONGLONG)in_stack_ffffffffffffff38,
                             (LONGLONG)nvarcols,(uchar *)colnums,status_01);
                      ffptbb(pfVar6,lVar2,(LONGLONG)in_stack_ffffffffffffff98,
                             in_stack_ffffffffffffff90,(uchar *)in_stack_ffffffffffffff88,
                             in_stack_ffffffffffffff80);
                      in_stack_ffffffffffffff90 = 0;
                      status_01 = *(int **)(*(long *)(in_RDI + 2) + 0x3d0);
                      for (in_stack_ffffffffffffff98 = (fitsfile *)0x0;
                          (long)in_stack_ffffffffffffff98 <
                          (long)*(int *)(*(long *)(in_RDI + 2) + 0x3b0);
                          in_stack_ffffffffffffff98 =
                               (fitsfile *)((long)&in_stack_ffffffffffffff98->HDUposition + 1)) {
                        status_03 = status_02;
                        if ((in_stack_ffffffffffffff90 < iVar5) &&
                           ((undefined1 *)(long)(&fptr_00->HDUposition)[in_stack_ffffffffffffff90]
                            == (undefined1 *)((long)&in_stack_ffffffffffffff98->HDUposition + 1))) {
                          ffgdesll(fptr,(int)((ulong)status_02 >> 0x20),CONCAT44(iVar5,iVar4),
                                   (LONGLONG *)CONCAT44(iVar3,in_stack_ffffffffffffff50),
                                   (LONGLONG *)fptr_00,status_00);
                          if (status_01[0x14] == -1) {
                            fptr_01 = (fitsfile *)((long)&nvarcols->field_0x7 / 8);
                          }
                          else {
                            fptr_01 = nvarcols;
                            if (status_01[0x14] != -0x10) {
                              fptr_01 = (fitsfile *)((long)nvarcols * *(long *)(status_01 + 0x26));
                            }
                          }
                          in_stack_ffffffffffffff88 =
                               (fitsfile *)
                               (*(long *)(*(long *)(in_RDI + 2) + 0x88) +
                                *(long *)(*(long *)(in_RDI + 2) + 0x3d8) + (long)colnums);
                          in_stack_ffffffffffffff80 =
                               (int *)(*(long *)(*(long *)(in_RSI + 2) + 0x88) +
                                       *(long *)(*(long *)(in_RSI + 2) + 0x3d8) +
                                      *(long *)(*(long *)(in_RSI + 2) + 0x3e0));
                          ffmbyt(in_stack_ffffffffffffff38,(LONGLONG)nvarcols,
                                 (int)((ulong)colnums >> 0x20),status_01);
                          if ((*(int *)(*(long *)(in_RSI + 2) + 0x38) == 0) &&
                             (*(long *)(*(long *)(*(long *)(in_RSI + 2) + 0x68) +
                                       (long)(*(int *)(*(long *)(in_RSI + 2) + 0x54) + 1) * 8) <
                              (long)in_stack_ffffffffffffff80 + (long)fptr_01)) {
                            in_stack_ffffffffffffff38 =
                                 (fitsfile *)
                                 ((((long)in_stack_ffffffffffffff80 + (long)fptr_01 + -1) -
                                  *(long *)(*(long *)(*(long *)(in_RSI + 2) + 0x68) +
                                           (long)(*(int *)(*(long *)(in_RSI + 2) + 0x54) + 1) * 8))
                                  / 0xb40 + 1);
                            iVar1 = ffiblk(in_stack_00001658,in_stack_00001650,in_stack_0000164c,
                                           in_stack_00001640);
                            if (0 < iVar1) {
                              ffpmsg((char *)0x124a00);
                              goto LAB_00124c99;
                            }
                          }
                          status_03 = status_02;
                          if (fptr_01 != (fitsfile *)0x0) {
                            if (((long)status_04 < (long)fptr_01) &&
                               (status_04 = fptr_01,
                               in_stack_ffffffffffffff18 = (int *)realloc(status_02,(size_t)fptr_01)
                               , status_03 = in_stack_ffffffffffffff18, fptr_01 = status_04,
                               in_stack_ffffffffffffff18 == (int *)0x0)) {
                              *in_R8 = 0x71;
                              ffpmsg((char *)0x124a55);
                              goto LAB_00124c99;
                            }
                            ffgbyt(fptr_01,(LONGLONG)status_04,fptr,status_03);
                            ffmbyt(in_stack_ffffffffffffff38,(LONGLONG)nvarcols,
                                   (int)((ulong)colnums >> 0x20),status_01);
                            ffpbyt(in_stack_ffffffffffffff88,(LONGLONG)in_stack_ffffffffffffff80,
                                   fptr_01,&status_04->HDUposition);
                          }
                          ffpdes(fptr,(int)((ulong)status_03 >> 0x20),CONCAT44(iVar5,iVar4),
                                 CONCAT44(iVar3,in_stack_ffffffffffffff50),(LONGLONG)fptr_00,
                                 status_00);
                          *(long *)(*(long *)(in_RSI + 2) + 0x3e0) =
                               (long)&fptr_01->HDUposition +
                               *(long *)(*(long *)(in_RSI + 2) + 0x3e0);
                          in_stack_ffffffffffffff90 = in_stack_ffffffffffffff90 + 1;
                        }
                        status_01 = status_01 + 0x28;
                        status_02 = status_03;
                      }
                      lVar2 = lVar2 + 1;
                    }
                  }
                  ffuky(in_stack_ffffffffffffff38,(int)((ulong)nvarcols >> 0x20),(char *)colnums,
                        status_01,(char *)in_stack_ffffffffffffff18,(int *)0x124c99);
                }
                else {
                  ffpmsg((char *)0x1246b2);
                  *in_R8 = 0x12e;
                }
LAB_00124c99:
                free(fptr);
                free(fptr_00);
                free(status_00);
                if (status_02 != (int *)0x0) {
                  free(status_02);
                }
                local_4 = *in_R8;
              }
            }
            else {
              ffpmsg((char *)0x124545);
              *in_R8 = 0x12e;
              local_4 = 0x12e;
            }
          }
          else {
            ffpmsg((char *)0x1244ad);
            *in_R8 = 0xf1;
            local_4 = 0xf1;
          }
        }
        else {
          local_4 = *in_R8;
        }
      }
    }
    else {
      local_4 = *in_R8;
    }
  }
  else {
    local_4 = *in_R8;
  }
  return local_4;
}

Assistant:

int ffcprw(fitsfile *infptr,    /* I - FITS file pointer to input file  */
           fitsfile *outfptr,   /* I - FITS file pointer to output file */
           LONGLONG firstrow,   /* I - number of first row to copy (1 based)  */
           LONGLONG nrows,      /* I - number of rows to copy  */
           int *status)         /* IO - error status     */
/*
  copy consecutive set of rows from infptr and append it in the outfptr table.
*/
{
    LONGLONG innaxis1, innaxis2, outnaxis1, outnaxis2, ii, jj, icol;
    LONGLONG iVarCol, inPos, outPos, nVarBytes, nVarAllocBytes = 0;
    unsigned char *buffer, *varColBuff=0;
    int nInVarCols=0, nOutVarCols=0, varColDiff=0;
    int *inVarCols=0, *outVarCols=0;
    long nNewBlocks;
    LONGLONG hrepeat=0, hoffset=0;
    tcolumn *colptr=0;
    
    if (*status > 0)
        return(*status);

    if (infptr->HDUposition != (infptr->Fptr)->curhdu)
    {
        ffmahd(infptr, (infptr->HDUposition) + 1, NULL, status);
    }
    else if ((infptr->Fptr)->datastart == DATA_UNDEFINED)
        ffrdef(infptr, status);                /* rescan header */

    if (outfptr->HDUposition != (outfptr->Fptr)->curhdu)
    {
        ffmahd(outfptr, (outfptr->HDUposition) + 1, NULL, status);
    }
    else if ((outfptr->Fptr)->datastart == DATA_UNDEFINED)
        ffrdef(outfptr, status);               /* rescan header */

    if (*status > 0)
        return(*status);

    if ((infptr->Fptr)->hdutype == IMAGE_HDU || (outfptr->Fptr)->hdutype == IMAGE_HDU)
    {
       ffpmsg
       ("Can not copy rows to or from IMAGE HDUs (ffcprw)");
       return(*status = NOT_TABLE);
    }

    if ( ((infptr->Fptr)->hdutype == BINARY_TBL &&  (outfptr->Fptr)->hdutype == ASCII_TBL) ||
         ((infptr->Fptr)->hdutype == ASCII_TBL &&  (outfptr->Fptr)->hdutype == BINARY_TBL) )
    {
       ffpmsg
       ("Copying rows between Binary and ASCII tables is not supported (ffcprw)");
       return(*status = NOT_BTABLE);
    }

    ffgkyjj(infptr,  "NAXIS1", &innaxis1,  0, status);  /* width of input rows */
    ffgkyjj(infptr,  "NAXIS2", &innaxis2,  0, status);  /* no. of input rows */
    ffgkyjj(outfptr, "NAXIS1", &outnaxis1, 0, status);  /* width of output rows */
    ffgkyjj(outfptr, "NAXIS2", &outnaxis2, 0, status);  /* no. of output rows */

    if (*status > 0)
        return(*status);

    if (outnaxis1 != innaxis1) {
       ffpmsg
       ("Input and output tables do not have same width (ffcprw)");
       return(*status = BAD_ROW_WIDTH);
    }    

    if (firstrow + nrows - 1 > innaxis2) {
       ffpmsg
       ("Not enough rows in input table to copy (ffcprw)");
       return(*status = BAD_ROW_NUM);
    }
    
    if ((infptr->Fptr)->tfield != (outfptr->Fptr)->tfield)
    {
       ffpmsg
       ("Input and output tables do not have same number of columns (ffcprw)");
       return(*status = BAD_COL_NUM);
    }
    
    /* allocate buffer to hold 1 row of data */
    buffer = malloc( (size_t) innaxis1);
    if (!buffer) {
       ffpmsg
       ("Unable to allocate memory (ffcprw)");
       return(*status = MEMORY_ALLOCATION);
    }
 
    inVarCols = malloc(infptr->Fptr->tfield*sizeof(int));
    outVarCols = malloc(outfptr->Fptr->tfield*sizeof(int));
    fffvcl(infptr, &nInVarCols, inVarCols, status);
    fffvcl(outfptr, &nOutVarCols, outVarCols, status);
    if (nInVarCols != nOutVarCols)
       varColDiff=1;
    else
    {
       for (ii=0; ii<nInVarCols; ++ii)
       {
          if (inVarCols[ii] != outVarCols[ii])
          {
             varColDiff=1;
             break;
          }
       }
    }
    
    if (varColDiff)
    {
       ffpmsg("Input and output tables have different variable columns (ffcprw)");
       *status = BAD_COL_NUM;
       goto CLEANUP_RETURN;
    }
    
    jj = outnaxis2 + 1;
    if (nInVarCols)
    {
       ffirow(outfptr, outnaxis2, nrows, status);
       for (ii = firstrow; ii < firstrow + nrows; ii++)
       {
          fits_read_tblbytes (infptr, ii, 1, innaxis1, buffer, status);
          fits_write_tblbytes(outfptr, jj, 1, innaxis1, buffer, status);
          /* Now make corrections for variable length columns */
          iVarCol=0;
          colptr = (infptr->Fptr)->tableptr;
          for (icol=0; icol<(infptr->Fptr)->tfield; ++icol)
          {
             if (iVarCol < nInVarCols && inVarCols[iVarCol] == icol+1)
             {
                /* Copy from a variable length column */
                
                ffgdesll(infptr, icol+1, ii, &hrepeat, &hoffset, status);
                /* If this is a bit column, hrepeat will be number of
                   bits, not bytes. If it is a string column, hrepeat
		   is the number of bytes, twidth is the max col width 
		   and can be ignored.*/
                if (colptr->tdatatype == -TBIT)
		{
		   nVarBytes = (hrepeat+7)/8;
		}
		else if (colptr->tdatatype == -TSTRING)
		{
		   nVarBytes = hrepeat;
		}
		else
		{
		   nVarBytes = hrepeat*colptr->twidth*sizeof(char);
		}
                inPos = (infptr->Fptr)->datastart + (infptr->Fptr)->heapstart
				+ hoffset;
		outPos = (outfptr->Fptr)->datastart + (outfptr->Fptr)->heapstart
				+ (outfptr->Fptr)->heapsize;
                ffmbyt(infptr, inPos, REPORT_EOF, status);
		/* If this is not the last HDU in the file, then check if */
		/* extending the heap would overwrite the following header. */
		/* If so, then have to insert more blocks. */
                if ( !((outfptr->Fptr)->lasthdu) )
                {
		   if (outPos+nVarBytes > 
		      (outfptr->Fptr)->headstart[(outfptr->Fptr)->curhdu+1])
		   {
		      nNewBlocks = (long)(((outPos+nVarBytes - 1 -
                        (outfptr->Fptr)->headstart[(outfptr->Fptr)->
                        curhdu+1]) / 2880) + 1);
                      if (ffiblk(outfptr, nNewBlocks, 1, status) > 0)
                      {
                         ffpmsg("Failed to extend the size of the variable length heap (ffcprw)");
			 goto CLEANUP_RETURN;
                      }

		   }
                }
                if (nVarBytes)
		{
		   if (nVarBytes > nVarAllocBytes)
		   {
		     /* Grow the copy buffer to accomodate the new maximum size. 
			Note it is safe to call realloc() with null input pointer, 
			which is equivalent to malloc(). */
		     unsigned char *varColBuff1 = (unsigned char *) realloc(varColBuff, nVarBytes);
		     if (! varColBuff1)
		     {
		       *status = MEMORY_ALLOCATION;
		       ffpmsg("failed to allocate memory for variable column copy (ffcprw)");
		       goto CLEANUP_RETURN;
		     }
		     /* Record the new state */
		     varColBuff = varColBuff1;
		     nVarAllocBytes = nVarBytes;
		   }
		   /* Copy date from input to output */
                   ffgbyt(infptr, nVarBytes, varColBuff, status);
		   ffmbyt(outfptr, outPos, IGNORE_EOF, status);
                   ffpbyt(outfptr, nVarBytes, varColBuff, status);
		}
		ffpdes(outfptr, icol+1, jj, hrepeat, (outfptr->Fptr)->heapsize, status);
                (outfptr->Fptr)->heapsize += nVarBytes;
                ++iVarCol;
             }
             ++colptr;
          }
          ++jj;
       }
    }
    else
    {    
       /* copy the rows, 1 at a time */
       for (ii = firstrow; ii < firstrow + nrows; ii++) {
           fits_read_tblbytes (infptr,  ii, 1, innaxis1, buffer, status);
           fits_write_tblbytes(outfptr, jj, 1, innaxis1, buffer, status);
           jj++;
       }
    }
    outnaxis2 += nrows;
    fits_update_key(outfptr, TLONGLONG, "NAXIS2", &outnaxis2, 0, status);

 CLEANUP_RETURN:
    free(buffer);
    free(inVarCols);
    free(outVarCols);
    if (varColBuff) free(varColBuff);
    return(*status);
}